

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O2

void __thiscall
gl4cts::CopyImage::FunctionalTest::calculateDimmensions
          (FunctionalTest *this,GLenum target,GLuint level,GLuint width,GLuint height,
          GLuint *out_widths,GLuint *out_heights,GLuint *out_depths)

{
  bool bVar1;
  uint uVar2;
  GLuint GVar3;
  uint uVar4;
  GLuint GVar5;
  long lVar6;
  ulong uVar7;
  GLuint factors [3];
  
  bVar1 = Utils::isTargetMultilayer(target);
  GVar3 = 100;
  for (GVar5 = level; -1 < (int)GVar5; GVar5 = GVar5 - 1) {
    factors[GVar5] = GVar3;
    GVar3 = GVar3 * 2;
  }
  uVar4 = 0x32;
  for (uVar7 = (ulong)(level + 1); (uint)uVar7 < 3; uVar7 = uVar7 + 1) {
    factors[uVar7] = uVar4;
    uVar4 = uVar4 >> 1;
  }
  uVar4 = 1;
  if (bVar1) {
    uVar4 = 0xc;
  }
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    GVar3 = factors[lVar6];
    out_widths[lVar6] = (GVar3 * width) / 100;
    out_heights[lVar6] = (GVar3 * height) / 100;
    uVar2 = uVar4;
    if (target == 0x806f) {
      uVar2 = (GVar3 * 0xc) / 100;
    }
    out_depths[lVar6] = uVar2;
  }
  return;
}

Assistant:

void FunctionalTest::calculateDimmensions(GLenum target, GLuint level, GLuint width, GLuint height, GLuint* out_widths,
										  GLuint* out_heights, GLuint* out_depths) const
{
	GLuint		 divide = 100;
	GLuint		 factors[FUNCTIONAL_TEST_N_LEVELS];
	GLuint		 factor			= divide;
	const bool   is_multi_layer = Utils::isTargetMultilayer(target);
	const GLuint n_layers		= (true == is_multi_layer) ? FUNCTIONAL_TEST_N_LAYERS : 1;

	for (GLint i = (GLint)level; i >= 0; --i)
	{
		factors[i] = factor;
		factor *= 2;
	}

	factor = divide / 2;
	for (GLuint i = level + 1; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		factors[i] = factor;
		factor /= 2;
	}

	for (GLuint i = 0; i < FUNCTIONAL_TEST_N_LEVELS; ++i)
	{
		out_widths[i]  = width * factors[i] / divide;
		out_heights[i] = height * factors[i] / divide;

		if (GL_TEXTURE_3D == target)
		{
			out_depths[i] = FUNCTIONAL_TEST_N_LAYERS * factors[i] / divide;
		}
		else
		{
			out_depths[i] = n_layers;
		}
	}
}